

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall testing::Matcher<int>::Matcher(Matcher<int> *this,int value)

{
  MatcherBase<int> local_28;
  
  (this->super_MatcherBase<int>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<int>).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017f388;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<int>::
       GetVTable<testing::internal::MatcherBase<int>::ValuePolicy<testing::internal::EqMatcher<int>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017f388;
  local_28.buffer_.i._0_4_ = value;
  internal::MatcherBase<int>::operator=(&this->super_MatcherBase<int>,&local_28);
  internal::MatcherBase<int>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }